

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

AttVal * prvTidyDupAttrs(TidyDocImpl *doc,AttVal *attrs)

{
  Node *pNVar1;
  int iVar2;
  undefined4 uVar3;
  AttVal *attval;
  AttVal *pAVar4;
  tmbstr ptVar5;
  Attribute *pAVar6;
  Node *pNVar7;
  
  if (attrs == (AttVal *)0x0) {
    attval = (AttVal *)0x0;
  }
  else {
    attval = prvTidyNewAttribute(doc);
    pAVar6 = attrs->dict;
    pNVar7 = attrs->asp;
    pNVar1 = attrs->php;
    iVar2 = attrs->delim;
    uVar3 = *(undefined4 *)&attrs->field_0x24;
    ptVar5 = attrs->attribute;
    attval->next = attrs->next;
    attval->dict = pAVar6;
    attval->asp = pNVar7;
    attval->php = pNVar1;
    attval->delim = iVar2;
    *(undefined4 *)&attval->field_0x24 = uVar3;
    attval->attribute = ptVar5;
    attval->value = attrs->value;
    pAVar4 = prvTidyDupAttrs(doc,attrs->next);
    attval->next = pAVar4;
    ptVar5 = prvTidytmbstrdup(doc->allocator,attrs->attribute);
    attval->attribute = ptVar5;
    ptVar5 = prvTidytmbstrdup(doc->allocator,attrs->value);
    attval->value = ptVar5;
    pAVar6 = prvTidyFindAttribute(doc,attval);
    attval->dict = pAVar6;
    if (attrs->asp == (Node *)0x0) {
      pNVar7 = (Node *)0x0;
    }
    else {
      pNVar7 = prvTidyCloneNode(doc,attrs->asp);
    }
    attval->asp = pNVar7;
    if (attrs->php == (Node *)0x0) {
      pNVar7 = (Node *)0x0;
    }
    else {
      pNVar7 = prvTidyCloneNode(doc,attrs->php);
    }
    attval->php = pNVar7;
  }
  return attval;
}

Assistant:

AttVal *TY_(DupAttrs)( TidyDocImpl* doc, AttVal *attrs)
{
    AttVal *newattrs;

    if (attrs == NULL)
        return attrs;

    newattrs = TY_(NewAttribute)(doc);
    *newattrs = *attrs;
    newattrs->next = TY_(DupAttrs)( doc, attrs->next );
    newattrs->attribute = TY_(tmbstrdup)(doc->allocator, attrs->attribute);
    newattrs->value = TY_(tmbstrdup)(doc->allocator, attrs->value);
    newattrs->dict = TY_(FindAttribute)(doc, newattrs);
    newattrs->asp = attrs->asp ? TY_(CloneNode)(doc, attrs->asp) : NULL;
    newattrs->php = attrs->php ? TY_(CloneNode)(doc, attrs->php) : NULL;
    return newattrs;
}